

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O3

void __thiscall
CTcLibParserCmdline::scan_full_source(CTcLibParserCmdline *this,char *val,char *fname)

{
  textchar_t *str;
  CTcMakeModule *pCVar1;
  char url [8212];
  textchar_t atStack_2038 [8216];
  
  pCVar1 = CTcMake::add_module(this->mk_,fname,(char *)0x0,(char *)0x0,0);
  sprintf(atStack_2038,"%.*s%.*s",0x1000,this->lib_url_,0x1000,val);
  CTcMakeStr::set(&pCVar1->url_,atStack_2038);
  CTcMakeStr::set(&pCVar1->orig_name_,val);
  str = this->lib_url_;
  CTcMakeStr::set(&pCVar1->lib_name_,this->lib_name_);
  CTcMakeStr::set(&pCVar1->lib_url_,str);
  pCVar1->source_type_ = TCMOD_SOURCE_LIB;
  return;
}

Assistant:

void scan_full_source(const char *val, const char *fname)
    {
        char url[OSFNMAX*2 + 20];
        CTcMakeModule *mod;
        
        /* add the source module to our module list */
        mod = mk_->add_module(fname, 0, 0);

        /* 
         *   build the full URL for the module - this is the library URL
         *   prefix plus the "source:" value (not the full filename - simply
         *   the original unretouched value of the "source:" variable) 
         */
        sprintf(url, "%.*s%.*s", (int)OSFNMAX, lib_url_, (int)OSFNMAX, val);

        /* set the module's URL */
        mod->set_url(url);

        /* set the module's original name and library name */
        mod->set_orig_name(val);
        mod->set_from_lib(lib_name_, lib_url_);
    }